

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase671::run(TestCase671 *this)

{
  StructDataBitCount *this_00;
  Builder reader_00;
  Reader reader_01;
  initializer_list<unsigned_short> expected;
  initializer_list<unsigned_short> expected_00;
  initializer_list<unsigned_short> list;
  bool bVar1;
  uint uVar2;
  Type *func;
  Type *func_00;
  unsigned_short local_788 [4];
  iterator local_780;
  undefined8 local_778;
  Reader local_770;
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_750;
  bool local_719;
  undefined1 local_718 [7];
  bool _kj_shouldLog_9;
  bool local_6e1;
  undefined1 local_6e0 [7];
  bool _kj_shouldLog_8;
  bool local_6a9;
  undefined1 local_6a8 [7];
  bool _kj_shouldLog_7;
  bool local_671;
  undefined1 local_670 [7];
  bool _kj_shouldLog_6;
  uint local_640;
  uint local_63c;
  Fault local_638;
  Fault f_1;
  undefined1 local_610 [8];
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_> l_1;
  undefined1 *puStack_5d8;
  bool _kj_shouldLog_5;
  Maybe<kj::Exception> local_5d0;
  undefined1 local_470 [8];
  Reader reader;
  Builder local_428;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_410;
  bool local_3e1;
  undefined1 local_3e0 [7];
  bool _kj_shouldLog_4;
  bool local_3b1;
  undefined1 local_3b0 [7];
  bool _kj_shouldLog_3;
  bool local_381;
  undefined1 local_380 [7];
  bool _kj_shouldLog_2;
  bool local_351;
  undefined1 local_350 [7];
  bool _kj_shouldLog_1;
  uint local_328;
  uint local_324;
  Fault local_320;
  Fault f;
  undefined1 local_300 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_> l;
  undefined1 *puStack_2d0;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_2c8;
  unsigned_short local_168 [4];
  iterator local_160;
  undefined8 local_158;
  Builder local_150;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase671 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_150,(Builder *)local_128);
  local_168[0] = 0x1201;
  local_168[1] = 0x3400;
  local_168[2] = 0x5601;
  local_168[3] = 0x7801;
  local_160 = local_168;
  local_158 = 4;
  list._M_len = 4;
  list._M_array = local_160;
  AnyPointer::Builder::setAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_150,list);
  puStack_2d0 = local_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase671::run()::__0>
            (&local_2c8,(kj *)&stack0xfffffffffffffd30,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_2c8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_2c8);
  if (!bVar1) {
    l.builder._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (l.builder._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2a7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      l.builder._39_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)&f,(Builder *)local_128);
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)local_300,(Builder *)&f);
  uVar2 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::size
                    ((Builder *)local_300);
  if (uVar2 != 4) {
    local_324 = 4;
    local_328 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::size
                          ((Builder *)local_300);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_320,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x2ab,FAILED,"(4u) == (l.size())","4u, l.size()",&local_324,&local_328);
    kj::_::Debug::Fault::fatal(&local_320);
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_350,(Builder *)local_300,0);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_350);
  if (!bVar1) {
    local_351 = kj::_::Debug::shouldLog(ERROR);
    while (local_351 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ac,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
      local_351 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_380,(Builder *)local_300,1);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_380);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_381 = kj::_::Debug::shouldLog(ERROR);
    while (local_381 != false) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ad,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
      local_381 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_3b0,(Builder *)local_300,2);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_3b0);
  if (!bVar1) {
    local_3b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3b1 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2ae,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
      local_3b1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_3e0,(Builder *)local_300,3);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Builder::getF((Builder *)local_3e0);
  if (!bVar1) {
    local_3e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3e1 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2af,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
      local_3e1 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            (&local_428,(Builder *)local_128);
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_410,&local_428);
  reader._reader.nestingLimit._0_2_ = 0x1201;
  reader._reader.nestingLimit._2_2_ = 0x3400;
  reader._reader._44_2_ = 0x5601;
  reader._reader._46_2_ = 0x7801;
  expected_00._M_len = 4;
  expected_00._M_array = (iterator)&reader._reader.nestingLimit;
  reader_00.builder.capTable = local_410.builder.capTable;
  reader_00.builder.segment = local_410.builder.segment;
  reader_00.builder.ptr = local_410.builder.ptr;
  reader_00.builder.elementCount = local_410.builder.elementCount;
  reader_00.builder.step = local_410.builder.step;
  reader_00.builder.structDataSize = local_410.builder.structDataSize;
  reader_00.builder.structPointerCount = local_410.builder.structPointerCount;
  reader_00.builder.elementSize = local_410.builder.elementSize;
  reader_00.builder._39_1_ = local_410.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_00,expected_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::asReader
            ((Reader *)local_470,(Builder *)local_128);
  puStack_5d8 = local_128;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase671::run()::__1>
            (&local_5d0,(kj *)&stack0xfffffffffffffa28,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_5d0,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_5d0);
  if (!bVar1) {
    l_1.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (l_1.reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[112]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2b7,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr\""
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { root.getAnyPointerField().getAs<List<bool>>(); }) != nullptr"
                );
      l_1.reader._47_1_ = 0;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            ((Reader *)&f_1,(Reader *)local_470);
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>_>
              *)local_610,(Reader *)&f_1);
  uVar2 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_610);
  if (uVar2 != 4) {
    local_63c = 4;
    local_640 = List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::size
                          ((Reader *)local_610);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_638,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,699,FAILED,"(4u) == (l.size())","4u, l.size()",&local_63c,&local_640);
    kj::_::Debug::Fault::fatal(&local_638);
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_670,(Reader *)local_610,0);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_670);
  if (!bVar1) {
    local_671 = kj::_::Debug::shouldLog(ERROR);
    while (local_671 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,700,ERROR,"\"failed: expected \" \"l[0].getF()\"",
                 (char (*) [29])"failed: expected l[0].getF()");
      local_671 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_6a8,(Reader *)local_610,1);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_6a8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_6a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6a9 != false) {
      kj::_::Debug::log<char_const(&)[32]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2bd,ERROR,"\"failed: expected \" \"!(l[1].getF())\"",
                 (char (*) [32])"failed: expected !(l[1].getF())");
      local_6a9 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_6e0,(Reader *)local_610,2);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_6e0);
  if (!bVar1) {
    local_6e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6e1 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2be,ERROR,"\"failed: expected \" \"l[2].getF()\"",
                 (char (*) [29])"failed: expected l[2].getF()");
      local_6e1 = false;
    }
  }
  List<capnproto_test::capnp::test::TestLists::Struct1,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)local_718,(Reader *)local_610,3);
  bVar1 = capnproto_test::capnp::test::TestLists::Struct1::Reader::getF((Reader *)local_718);
  if (!bVar1) {
    local_719 = kj::_::Debug::shouldLog(ERROR);
    while (local_719 != false) {
      kj::_::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x2bf,ERROR,"\"failed: expected \" \"l[3].getF()\"",
                 (char (*) [29])"failed: expected l[3].getF()");
      local_719 = false;
    }
  }
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_770,(Reader *)local_470);
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_750,&local_770);
  local_788[0] = 0x1201;
  local_788[1] = 0x3400;
  local_788[2] = 0x5601;
  local_788[3] = 0x7801;
  local_780 = local_788;
  local_778 = 4;
  expected._M_len = 4;
  expected._M_array = local_780;
  reader_01.reader.capTable = local_750.reader.capTable;
  reader_01.reader.segment = local_750.reader.segment;
  reader_01.reader.ptr = local_750.reader.ptr;
  reader_01.reader.elementCount = local_750.reader.elementCount;
  reader_01.reader.step = local_750.reader.step;
  reader_01.reader.structDataSize = local_750.reader.structDataSize;
  reader_01.reader.structPointerCount = local_750.reader.structPointerCount;
  reader_01.reader.elementSize = local_750.reader.elementSize;
  reader_01.reader._39_1_ = local_750.reader._39_1_;
  reader_01.reader.nestingLimit = local_750.reader.nestingLimit;
  reader_01.reader._44_4_ = local_750.reader._44_4_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_01,expected);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, BitListDowngrade) {
  // NO LONGER SUPPORTED -- We check for exceptions thrown.

  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({0x1201u, 0x3400u, 0x5601u, 0x7801u});

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});

  auto reader = root.asReader();

  EXPECT_NONFATAL_FAILURE(root.getAnyPointerField().getAs<List<bool>>());

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct1>>();
    ASSERT_EQ(4u, l.size());
    EXPECT_TRUE(l[0].getF());
    EXPECT_FALSE(l[1].getF());
    EXPECT_TRUE(l[2].getF());
    EXPECT_TRUE(l[3].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(),
            {0x1201u, 0x3400u, 0x5601u, 0x7801u});
}